

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkDupDfsNoBarBufs(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pFanin;
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  char *pcVar5;
  int iVar6;
  long lVar7;
  
  if (pNtk == (Abc_Ntk_t *)0x0) {
    pNtk_00 = (Abc_Ntk_t *)0x0;
  }
  else {
    if (pNtk->ntkType != ABC_NTK_LOGIC) {
      __assert_fail("Abc_NtkIsLogic(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                    ,0x213,"Abc_Ntk_t *Abc_NtkDupDfsNoBarBufs(Abc_Ntk_t *)");
    }
    if (pNtk->nBarBufs2 < 1) {
      __assert_fail("pNtk->nBarBufs2 > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                    ,0x214,"Abc_Ntk_t *Abc_NtkDupDfsNoBarBufs(Abc_Ntk_t *)");
    }
    pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,pNtk->ntkFunc);
    p = Abc_NtkDfs2(pNtk);
    for (iVar6 = 0; iVar6 < p->nSize; iVar6 = iVar6 + 1) {
      pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(p,iVar6);
      iVar1 = Abc_ObjIsBarBuf(pAVar3);
      if (iVar1 == 0) {
        Abc_NtkDupObj(pNtk_00,pAVar3,0);
      }
      else {
        pAVar3->field_6 =
             *(anon_union_8_4_617c9805_for_Abc_Obj_t__17 *)
              ((long)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray] + 0x40);
      }
    }
    Vec_PtrFree(p);
    for (iVar6 = 0; iVar6 < pNtk->vObjs->nSize; iVar6 = iVar6 + 1) {
      pAVar3 = Abc_NtkObj(pNtk,iVar6);
      if ((((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xe) != 8)) &&
          (uVar2 = *(uint *)&pAVar3->field_0x14 & 0xf, uVar2 != 5)) && (uVar2 != 10)) {
        iVar1 = Abc_ObjIsBarBuf(pAVar3);
        if (iVar1 == 0) {
          for (lVar7 = 0; lVar7 < (pAVar3->vFanins).nSize; lVar7 = lVar7 + 1) {
            if (((pAVar3->field_6).pCopy != (Abc_Obj_t *)0x0) &&
               (pFanin = *(Abc_Obj_t **)
                          ((long)pAVar3->pNtk->vObjs->pArray[(pAVar3->vFanins).pArray[lVar7]] + 0x40
                          ), pFanin != (Abc_Obj_t *)0x0)) {
              Abc_ObjAddFanin((pAVar3->field_6).pCopy,pFanin);
            }
          }
        }
      }
    }
    if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
      pAVar4 = Abc_NtkDup(pNtk->pExdc);
      pNtk_00->pExdc = pAVar4;
    }
    if ((Abc_Ntk_t *)pNtk->pExcare != (Abc_Ntk_t *)0x0) {
      pAVar4 = Abc_NtkDup((Abc_Ntk_t *)pNtk->pExcare);
      pNtk_00->pExcare = pAVar4;
    }
    if (pNtk->pManTime != (Abc_ManTime_t *)0x0) {
      Abc_NtkTimeInitialize(pNtk_00,pNtk);
    }
    if (pNtk->vPhases != (Vec_Int_t *)0x0) {
      Abc_NtkTransferPhases(pNtk_00,pNtk);
    }
    if (pNtk->pWLoadUsed != (char *)0x0) {
      pcVar5 = Abc_UtilStrsav(pNtk->pWLoadUsed);
      pNtk_00->pWLoadUsed = pcVar5;
    }
    iVar6 = Abc_NtkCheck(pNtk_00);
    if (iVar6 == 0) {
      fwrite("Abc_NtkDup(): Network check has failed.\n",0x28,1,_stdout);
    }
    pNtk->pCopy = pNtk_00;
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkDupDfsNoBarBufs( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    if ( pNtk == NULL )
        return NULL;
    assert( Abc_NtkIsLogic(pNtk) );
    assert( pNtk->nBarBufs2 > 0 );
    // start the network
    pNtkNew = Abc_NtkStartFrom( pNtk, pNtk->ntkType, pNtk->ntkFunc );
    // copy the internal nodes
    vNodes = Abc_NtkDfs2( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        if ( Abc_ObjIsBarBuf(pObj) )
            pObj->pCopy = Abc_ObjFanin0(pObj)->pCopy;
        else
            Abc_NtkDupObj( pNtkNew, pObj, 0 );
    Vec_PtrFree( vNodes );
    // reconnect all objects (no need to transfer attributes on edges)
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_ObjIsBox(pObj) && !Abc_ObjIsBo(pObj) && !Abc_ObjIsBarBuf(pObj) )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                if ( pObj->pCopy && pFanin->pCopy )
                    Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
    // duplicate the EXDC Ntk
    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
    if ( pNtk->pExcare )
        pNtkNew->pExcare = Abc_NtkDup( (Abc_Ntk_t *)pNtk->pExcare );
    // duplicate timing manager
    if ( pNtk->pManTime )
        Abc_NtkTimeInitialize( pNtkNew, pNtk );
    if ( pNtk->vPhases )
        Abc_NtkTransferPhases( pNtkNew, pNtk );
    if ( pNtk->pWLoadUsed )
        pNtkNew->pWLoadUsed = Abc_UtilStrsav( pNtk->pWLoadUsed );
    // check correctness
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkDup(): Network check has failed.\n" );
    pNtk->pCopy = pNtkNew;
    return pNtkNew;
}